

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O3

vector sptk::swipe::pitch(matrix S,vector pc,double st)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *extraout_RDX;
  double *extraout_RDX_00;
  double *pdVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  double **ppdVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  vector B;
  vector vVar23;
  vector vVar24;
  vector vVar25;
  vector vVar26;
  vector coefs;
  vector yr_vector;
  vector yr_vector_00;
  double *pdVar7;
  double *extraout_RDX_01;
  
  pdVar4 = pc.v;
  ppdVar12 = S.m;
  dVar16 = log(pdVar4[2]);
  dVar1 = log(*pdVar4);
  auVar18._8_8_ = dVar1;
  auVar18._0_8_ = dVar16;
  auVar19 = divpd(auVar18,_DAT_0012b220);
  dVar16 = (auVar19._0_8_ - auVar19._8_8_) / 0.0013028 + 1.0;
  dVar1 = floor(dVar16 + *(double *)(&DAT_0012b200 + (ulong)(dVar16 < 0.0) * 8));
  dVar16 = pdVar4[1];
  vVar23 = makev(3);
  pdVar5 = vVar23.v;
  vVar24 = makev(3);
  pdVar6 = vVar24.v;
  auVar19._8_4_ = SUB84(dVar16,0);
  auVar19._0_8_ = *pdVar4;
  auVar19._12_4_ = (int)((ulong)dVar16 >> 0x20);
  auVar19 = divpd(_DAT_0012b230,auVar19);
  auVar20._8_4_ = auVar19._8_4_;
  auVar20._0_8_ = auVar19._8_8_;
  auVar20._12_4_ = auVar19._12_4_;
  auVar20 = divpd(auVar19,auVar20);
  dVar16 = auVar20._0_8_ + -1.0;
  dVar21 = auVar20._8_8_ + -1.0;
  *pdVar6 = (dVar16 + dVar16) * 3.141592653589793;
  pdVar6[1] = (dVar21 + dVar21) * 3.141592653589793;
  dVar16 = (1.0 / pdVar4[2]) / auVar19._8_8_ + -1.0;
  pdVar6[2] = (dVar16 + dVar16) * 3.141592653589793;
  vVar25 = makev(S.y);
  yr_vector_00.v = vVar25.v;
  if (S.y != 0 && -1 < (long)S._0_8_) {
    uVar2 = S.x;
    uVar11 = 0xffffffff;
    uVar13 = 0;
    do {
      if ((int)uVar2 < 1) {
        dVar16 = -32768.0;
      }
      else {
        uVar3 = 0;
        uVar14 = 0;
        uVar15 = 0xc0e00000;
        do {
          dVar16 = ppdVar12[uVar3][uVar13];
          if ((double)CONCAT44(uVar15,uVar14) <= dVar16 && dVar16 != (double)CONCAT44(uVar15,uVar14)
             ) {
            uVar11 = uVar3 & 0xffffffff;
          }
          if (dVar16 <= (double)CONCAT44(uVar15,uVar14)) {
            dVar16 = (double)CONCAT44(uVar15,uVar14);
          }
          uVar3 = uVar3 + 1;
          uVar14 = SUB84(dVar16,0);
          uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
        } while ((uVar2 & 0x7fffffff) != uVar3);
      }
      uVar14 = 0;
      uVar15 = 0;
      if (st < dVar16) {
        iVar10 = (int)uVar11;
        if (iVar10 == uVar2 - 1 || iVar10 == 0) {
          uVar14 = SUB84(*pdVar4,0);
          uVar15 = (undefined4)((ulong)*pdVar4 >> 0x20);
        }
        else {
          dVar16 = pdVar4[iVar10];
          dVar21 = log(pdVar4[(long)iVar10 + -1]);
          *pdVar5 = ppdVar12[(long)iVar10 + -1][uVar13];
          pdVar5[1] = ppdVar12[iVar10][uVar13];
          pdVar5[2] = ppdVar12[(long)iVar10 + 1][uVar13];
          vVar26._4_4_ = 0;
          vVar26.x = vVar24.x;
          B._4_4_ = 0;
          B.x = vVar23.x;
          vVar26.v = pdVar6;
          B.v = pdVar5;
          vVar26 = polyfit(vVar26,B,2);
          pdVar7 = vVar26.v;
          pdVar8 = pdVar7;
          if (0 < (int)dVar1) {
            uVar9 = 0;
            dVar22 = 0.0;
            uVar15 = 0;
            uVar14 = 0xc0e00000;
            do {
              dVar17 = exp2(dVar22 * 0.0013028 + dVar21 / 0.6931471805599453);
              dVar17 = (1.0 / dVar17) / (1.0 / dVar16) + -1.0;
              coefs.v = extraout_RDX;
              coefs._0_8_ = pdVar7;
              dVar17 = polyval((swipe *)(vVar26._0_8_ & 0xffffffff),coefs,
                               (dVar17 + dVar17) * 3.141592653589793);
              if ((double)CONCAT44(uVar14,uVar15) < dVar17) {
                uVar11 = (ulong)uVar9;
                uVar14 = (int)((ulong)dVar17 >> 0x20);
                uVar15 = SUB84(dVar17,0);
              }
              dVar22 = dVar22 + 1.0;
              uVar9 = uVar9 + 1;
              pdVar8 = extraout_RDX_00;
            } while ((int)dVar1 != uVar9);
          }
          yr_vector.v = pdVar8;
          yr_vector._0_8_ = pdVar7;
          freev((swipe *)(vVar26._0_8_ & 0xffffffff),yr_vector);
          dVar16 = exp2((double)(int)uVar11 * 0.0013028 + dVar21 / 0.6931471805599453);
          uVar14 = SUB84(dVar16,0);
          uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
        }
      }
      yr_vector_00.v[uVar13] = (double)CONCAT44(uVar15,uVar14);
      uVar13 = uVar13 + 1;
    } while (uVar13 != S._0_8_ >> 0x20);
  }
  yr_vector_00._0_8_ = pdVar6;
  freev((swipe *)(ulong)(uint)vVar24.x,yr_vector_00);
  vVar24.v = extraout_RDX_01;
  vVar24._0_8_ = pdVar5;
  freev((swipe *)(ulong)(uint)vVar23.x,vVar24);
  vVar25._4_4_ = 0;
  vVar25.v = yr_vector_00.v;
  return vVar25;
}

Assistant:

vector pitch(matrix S, vector pc, double st) {
    int i, j;
    int maxi = -1;
    int search = (int) round((log2(pc.v[2]) - log2(pc.v[0])) / POLYV + 1.);
    double nftc, maxv, log2pc;
    double tc2 = 1. / pc.v[1];
    vector coefs;
    vector s = makev(3);
    vector ntc = makev(3);
    ntc.v[0] = ((1. / pc.v[0]) / tc2 - 1.) * 2. * M_PI; 
    ntc.v[1] = (tc2 / tc2 - 1.) * 2. * M_PI; 
    ntc.v[2] = ((1. / pc.v[2]) / tc2 - 1.) * 2. * M_PI;
    vector p = makev(S.y);  
    for (j = 0; j < S.y; j++) {
        maxv = SHRT_MIN;  
        for (i = 0; i < S.x; i++) {
            if (S.m[i][j] > maxv) {
                maxv = S.m[i][j];
                maxi = i;
            }
        }
        if (maxv > st) { // make sure it's big enough
            if (maxi == 0 || maxi == S.x - 1) p.v[j] = pc.v[0];
            else { // general case
                tc2 = 1. / pc.v[maxi];
                log2pc = log2(pc.v[maxi - 1]); 
                s.v[0] = S.m[maxi - 1][j];
                s.v[1] = S.m[maxi][j];
                s.v[2] = S.m[maxi + 1][j]; 
                coefs = polyfit(ntc, s, 2); 
                maxv = SHRT_MIN; 
                for (i = 0; i < search; i++) { // check the nftc space
                    nftc = polyval(coefs, ((1. / pow(2, i * POLYV + 
                                   log2pc)) / tc2 - 1) * 2 * M_PI);
                    if (nftc > maxv) {
                        maxv = nftc;
                        maxi = i;
                    }
                } // now we've got the pitch numbers we need
                freev(coefs);
                p.v[j] = pow(2, log2pc + (maxi * POLYV));
            }
        }
        else 
#if 0
            p.v[j] = NAN;
#else
            p.v[j] = 0.0;
#endif
    }
    freev(ntc);
    freev(s);
    return(p);
}